

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O0

void __thiscall nite::NavUI::update(NavUI *this,BaseUIComponent *comp)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint key_00;
  NavUI *this_00;
  function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)> *this_01;
  ListenerInfo *__p;
  __shared_ptr_access<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  size_type sVar6;
  element_type *peVar7;
  int local_13c;
  int local_12c;
  int local_120;
  int local_11c;
  int local_10c;
  float local_c4;
  Color *local_c0;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  string local_80;
  reference local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>
  *key;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>_>_>
  *__range2;
  undefined1 auStack_38 [7];
  bool lrpUpd;
  anon_class_16_2_044dc475 solveAutoScroll;
  anon_class_16_2_3ef9e608 getSelectedChild;
  BaseUIComponent *comp_local;
  NavUI *this_local;
  
  if (comp != (BaseUIComponent *)0x0) {
    solveAutoScroll.getSelectedChild = (anon_class_16_2_3ef9e608 *)&getSelectedChild.this;
    _auStack_38 = &getSelectedChild.this;
    solveAutoScroll.comp = (BaseUIComponent **)&solveAutoScroll.getSelectedChild;
    if ((this->colorFlip & 1U) == 0) {
      local_c0 = &this->b;
    }
    else {
      local_c0 = &this->a;
    }
    local_c4 = 0.34;
    if ((this->colorFlip & 1U) == 0) {
      local_c4 = 0.11;
    }
    getSelectedChild.comp = (BaseUIComponent **)this;
    getSelectedChild.this = (NavUI *)comp;
    bVar2 = Color::cInterpDiscrete(&this->color,local_c0,local_c4);
    if (((uint)getSelectedChild.this[4].a.r & 0x100) != 0) {
      this_00 = getSelectedChild.this + 0xc;
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>_>_>
                        *)this_00);
      key = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>_>_>
                      *)this_00);
      while (bVar3 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>,_true>
                                  *)&key), bVar3) {
        local_60 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>,_false,_true>
                   ::operator*(&__end2);
        std::__cxx11::string::string((string *)&local_80,(string *)local_60);
        key_00 = translateKey(&local_80);
        bVar3 = keyboardPressed(key_00);
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar3) {
          this_01 = &local_60->second;
          __p = (ListenerInfo *)operator_new(1);
          std::shared_ptr<nite::ListenerInfo>::shared_ptr<nite::ListenerInfo,void>
                    ((shared_ptr<nite::ListenerInfo> *)local_a0,__p);
          std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>
          ::operator()(this_01,(shared_ptr<nite::ListenerInfo> *)local_a0,
                       (BaseUIComponent *)getSelectedChild.this);
          std::shared_ptr<nite::ListenerInfo>::~shared_ptr
                    ((shared_ptr<nite::ListenerInfo> *)local_a0);
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>_>,_false,_true>
        ::operator++(&__end2);
      }
    }
    if (((this->enable & 1U) != 0) && (bVar2)) {
      this->colorFlip = (bool)((this->colorFlip ^ 0xffU) & 1);
      (**(code **)(*(long *)getSelectedChild.this + 0x38))();
    }
    if (((this->enable & 1U) != 0) && (!bVar2)) {
      (**(code **)(*(long *)getSelectedChild.this + 0x38))();
    }
    if (((this->enable & 1U) != 0) &&
       (bVar2 = keyboardPressed(*(uint *)&getSelectedChild.this[0xb].colorFlip), bVar2)) {
      for (local_a4 = 0;
          sVar6 = std::
                  vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                  ::size((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          *)&getSelectedChild.this[3].color.g), (ulong)(long)local_a4 < sVar6;
          local_a4 = local_a4 + 1) {
        p_Var4 = (__shared_ptr_access<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                    ::operator[]((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                  *)&getSelectedChild.this[3].color.g,(long)local_a4);
        peVar5 = std::
                 __shared_ptr_access<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var4);
        if ((peVar5->nav).index == this->current) {
          p_Var4 = (__shared_ptr_access<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)std::
                      vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                      ::operator[]((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                    *)&getSelectedChild.this[3].color.g,(long)local_a4);
          peVar5 = std::
                   __shared_ptr_access<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var4);
          (*peVar5->_vptr_BaseUIComponent[10])();
        }
      }
    }
    if (((this->enable & 1U) != 0) && (bVar2 = keyboardPressed(0x48), bVar2)) {
      peVar7 = std::
               __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&getSelectedChild.this[3].b.g);
      if ((((peVar7->xorient & 1U) == 0) ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0)) &&
         ((peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->xorient & 1U) != 0 ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) == 0))))
      {
        peVar7 = std::
                 __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&getSelectedChild.this[3].b.g);
        if (((peVar7->xorient & 1U) != 0) &&
           ((peVar7 = std::
                      __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0 &&
            (this->split != 0)))) {
          if (((this->current + 1) % this->split == 0) ||
             (iVar1 = this->current,
             sVar6 = std::
                     vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                     ::size((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                             *)&getSelectedChild.this[3].color.g),
             sVar6 - 1 < (ulong)(long)(iVar1 + 1))) {
            local_11c = this->current;
          }
          else {
            local_11c = this->current + 1;
          }
          this->current = local_11c;
        }
      }
      else {
        iVar1 = this->current;
        sVar6 = std::
                vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                ::size((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                        *)&getSelectedChild.this[3].color.g);
        if ((ulong)(long)(iVar1 + 1) < sVar6) {
          local_10c = this->current + 1;
        }
        else {
          local_10c = this->current;
        }
        this->current = local_10c;
      }
      update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)auStack_38);
      (**(code **)(*(long *)getSelectedChild.this + 0x38))();
    }
    if (((this->enable & 1U) != 0) && (bVar2 = keyboardPressed(0x47), bVar2)) {
      peVar7 = std::
               __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&getSelectedChild.this[3].b.g);
      if ((((peVar7->xorient & 1U) == 0) ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0)) &&
         ((peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->xorient & 1U) != 0 ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) == 0))))
      {
        peVar7 = std::
                 __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&getSelectedChild.this[3].b.g);
        if (((peVar7->xorient & 1U) != 0) &&
           (((peVar7 = std::
                       __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0
             && (this->split != 0)) &&
            ((this->current = this->current + -1, this->current < 0 ||
             ((this->current + 1) % this->split == 0)))))) {
          this->current = this->current + 1;
        }
      }
      else {
        if (this->current + -1 < 0) {
          local_120 = this->current;
        }
        else {
          local_120 = this->current + -1;
        }
        this->current = local_120;
      }
      update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)auStack_38);
      (**(code **)(*(long *)getSelectedChild.this + 0x38))();
    }
    if (((this->enable & 1U) != 0) && (bVar2 = keyboardPressed(0x4a), bVar2)) {
      peVar7 = std::
               __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&getSelectedChild.this[3].b.g);
      if ((((peVar7->xorient & 1U) == 0) ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0)) &&
         ((peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->xorient & 1U) != 0 ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) == 0))))
      {
        peVar7 = std::
                 __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&getSelectedChild.this[3].b.g);
        if (((peVar7->xorient & 1U) != 0) &&
           ((peVar7 = std::
                      __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0 &&
            (this->split != 0)))) {
          this->current = this->split + this->current;
          iVar1 = this->current;
          sVar6 = std::
                  vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                  ::size((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          *)&getSelectedChild.this[3].color.g);
          if (sVar6 - 1 < (ulong)(long)iVar1) {
            this->current = this->current - this->split;
          }
        }
      }
      else {
        iVar1 = this->index;
        sVar6 = std::
                vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                ::size((vector<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                        *)&getSelectedChild.this[3].color.g);
        if ((ulong)(long)(iVar1 + 1) < sVar6) {
          local_12c = this->current + 1;
        }
        else {
          local_12c = this->current;
        }
        this->current = local_12c;
      }
      update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)auStack_38);
      (**(code **)(*(long *)getSelectedChild.this + 0x38))();
    }
    if (((this->enable & 1U) != 0) && (bVar2 = keyboardPressed(0x49), bVar2)) {
      peVar7 = std::
               __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&getSelectedChild.this[3].b.g);
      if ((((peVar7->xorient & 1U) == 0) ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0)) &&
         ((peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->xorient & 1U) != 0 ||
          (peVar7 = std::
                    __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) == 0))))
      {
        peVar7 = std::
                 __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&getSelectedChild.this[3].b.g);
        if (((peVar7->xorient & 1U) != 0) &&
           (((peVar7 = std::
                       __shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&getSelectedChild.this[3].b.g), (peVar7->yorient & 1U) != 0
             && (this->split != 0)) &&
            (this->current = this->current - this->split, this->current < 0)))) {
          this->current = this->split + this->current;
        }
      }
      else {
        if (this->index + -1 < 0) {
          local_13c = this->current;
        }
        else {
          local_13c = this->current + -1;
        }
        this->current = local_13c;
      }
      update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)auStack_38);
      (**(code **)(*(long *)getSelectedChild.this + 0x38))();
    }
  }
  return;
}

Assistant:

void nite::NavUI::update(BaseUIComponent *comp){
    if(comp == NULL){
        return;
    }

    auto getSelectedChild = [&](){
        for(int i = 0; i < comp->children.size(); ++i){
            if(comp->children[i]->nav.index == current){
                return comp->children[i];
            }
        }
        return Shared<nite::BaseUIComponent>(NULL);
    };

    auto solveAutoScroll = [&](){
        if(!comp->allowOverflow){
            return;
        }
        auto child = getSelectedChild();
        if(child.get() == NULL){
            return;
        }
        auto space = comp->computeSize();
        auto area = child->computeSize();
        auto p = child->position + comp->scrollOffset;
        if( p.x + area.x * 0.5f <= 0.0f || p.y + area.y * 0.5f <= 0.0f || 
            p.x - area.x * 0.5f >= space.x || p.y - area.y * 0.5f >= space.y ||
            p.x - area.x * 0.5f < 0.0f || p.y - area.y * 0.5f < 0.0f || 
            p.x + area.x * 0.5f > space.x || p.y + area.y * 0.5f > space.y){
            // TODO: this is going to change to accodomate vinline (instead of left to right, top to bottom)
            // see commented line below
            comp->scrollOffset.y = -(child->position.y - area.y * 0.5f) + area.y;
            //comp->scrollOffset.x = -(child->position.x - area.x * 0.5f);
            comp->recalculate();
        }        
    };

	auto lrpUpd = color.cInterpDiscrete(colorFlip ? a : b, colorFlip ? 0.34f : 0.11f);

	if(comp->visible){
		for(auto &key : comp->keyListeners){
			if(nite::keyboardPressed(nite::translateKey(key.first))){
				key.second(Shared<nite::ListenerInfo>(new nite::ListenerInfo()), comp);
			}
		}		
	}

	if(enable && lrpUpd){
		colorFlip = !colorFlip;
		comp->recalculate();
	}

	if(enable && !lrpUpd){
		comp->recalculate();	
	}

	if(enable && nite::keyboardPressed(comp->onClickAnalogueKey)){
		for(int i = 0; i < comp->children.size(); ++i){
			if(comp->children[i]->nav.index == current){
				comp->children[i]->onClick();
			}
		}
	}

	if(enable && nite::keyboardPressed(nite::keyRIGHT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current = (current + 1) % split == 0 || (current + 1) > comp->children.size()-1 ? current : current + 1;
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyLEFT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			--current;
			if(current < 0 || (current + 1) % split == 0){
				++current;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyDOWN)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current += split;
			if(current > comp->children.size()-1){
				current -= split;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}	


	if(enable && nite::keyboardPressed(nite::keyUP)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current -= split;
			if(current < 0){
				current += split;
			}
		}	      
        solveAutoScroll();	
		comp->recalculate();
	}
}